

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O2

string * __thiscall
ent::muistringvalue::asstring_abi_cxx11_(string *__return_storage_ptr__,muistringvalue *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  cstrescape<std::__cxx11::string>(&local_30,&this->_value);
  std::operator+(&local_50,"mui_sz:\"",&local_30);
  std::operator+(__return_storage_ptr__,&local_50,"\"");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string asstring()
    {
        return "mui_sz:\""+cstrescape(_value)+"\"";
    }